

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O0

void __thiscall
rapidjson::
GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::AddError(GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
           *this,GValue *keyword,GValue *error)

{
  bool bVar1;
  Pointer pVVar2;
  undefined1 local_40 [8];
  GValue errors;
  undefined1 local_28 [8];
  MemberIterator member;
  GValue *error_local;
  GValue *keyword_local;
  GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  *this_local;
  
  member.ptr_ = (Pointer)error;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::FindMember<rapidjson::CrtAllocator>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)local_28,&this->error_)
  ;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::MemberEnd
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
             ((long)&errors.data_ + 8));
  bVar1 = GenericMemberIterator<false,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::operator==
                    ((GenericMemberIterator<false,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *)
                     local_28,(GenericMemberIterator<false,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                               *)&errors.data_.s.str);
  if (bVar1) {
    GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::AddMember
              (&this->error_,keyword,&(member.ptr_)->name,this->allocator_);
  }
  else {
    pVVar2 = GenericMemberIterator<false,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
             operator->((GenericMemberIterator<false,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                         *)local_28);
    bVar1 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::IsObject(&pVVar2->value);
    if (bVar1) {
      GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GenericValue
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)local_40,kArrayType
                );
      pVVar2 = GenericMemberIterator<false,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
               operator->((GenericMemberIterator<false,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                           *)local_28);
      GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::PushBack
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)local_40,
                 &pVVar2->value,this->allocator_);
      pVVar2 = GenericMemberIterator<false,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
               operator->((GenericMemberIterator<false,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                           *)local_28);
      GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::operator=
                (&pVVar2->value,
                 (GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)local_40);
      GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)local_40);
    }
    pVVar2 = GenericMemberIterator<false,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
             operator->((GenericMemberIterator<false,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                         *)local_28);
    GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::PushBack
              (&pVVar2->value,&(member.ptr_)->name,this->allocator_);
  }
  return;
}

Assistant:

void AddError(GValue& keyword, GValue& error) {
      typename GValue::MemberIterator member = error_.FindMember(keyword);
      if (member == error_.MemberEnd())
        error_.AddMember(keyword, error, *allocator_);
      else {
        if (member->value.IsObject()) {
          GValue errors(kArrayType);
          errors.PushBack(member->value, *allocator_);
          member->value = errors;
        }
        member->value.PushBack(error, *allocator_);
      }
    }